

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void Am_Animator_Interrupt_proc(Am_Object *interp,Am_Value *new_value)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Value_List *pAVar5;
  Am_Wrapper *value;
  Am_Object local_60;
  Am_Value_List values;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value_List local_38;
  
  pAVar4 = Am_Object::Get(interp,0xf9,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    Am_Value_List::Am_Value_List(&values);
    pAVar4 = Am_Object::Get(interp,0xfa,0);
    Am_Value_List::operator=(&values,pAVar4);
    pAVar4 = Am_Object::Get(interp,0xfb,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if ((iVar3 < 0) || (uVar2 = Am_Value_List::Length(&values), (int)(uVar2 - 1) <= iVar3)) {
      Am_Value_List::Am_Value_List(&local_38);
      pAVar4 = Am_Object::Get(interp,0x181,0);
      pAVar5 = Am_Value_List::Add(&local_38,pAVar4,Am_TAIL,true);
      pAVar4 = Am_Object::Get(interp,0x182,0);
      pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
      Am_Value_List::operator=(&values,pAVar5);
      Am_Value_List::~Am_Value_List(&local_38);
      Am_Object::Set(interp,0xfb,0,0);
    }
    Am_Value_List::Add(&values,new_value,Am_TAIL,true);
    value = Am_Value_List::operator_cast_to_Am_Wrapper_(&values);
    Am_Object::Set(interp,0xfa,value,0);
    Am_Object::Am_Object(&local_60,interp);
    Am_Set_Animated_Slots(&local_60);
    Am_Object::~Am_Object(&local_60);
    Am_Value_List::~Am_Value_List(&values);
    return;
  }
  pAVar4 = Am_Object::Get(interp,0x169,0);
  Am_Object::Am_Object(&local_40,interp);
  Am_Abort_Animator(&local_40);
  Am_Object::~Am_Object(&local_40);
  bVar1 = Am_Value::operator!=(pAVar4,new_value);
  if (!bVar1) {
    return;
  }
  Am_Object::Am_Object(&local_48,interp);
  Am_Start_Animator(&local_48,pAVar4,new_value);
  Am_Object::~Am_Object(&local_48);
  return;
}

Assistant:

Am_Define_Method(Am_Anim_Update_Method, void, Am_Animator_Interrupt,
                 (Am_Object interp, const Am_Value &new_value))
{
  if ((bool)interp.Get(Am_INTERRUPTIBLE)) {
    const Am_Value& curr_value = interp.Get(Am_VALUE);
    Am_INTER_TRACE_PRINT(interp, "Animator Interrupt of "
                                     << interp << "; restarting from value "
                                     << curr_value << " towards new value "
                                     << new_value);
    Am_Abort_Animator(interp);

    if (curr_value != new_value)
      Am_Start_Animator(interp, curr_value, new_value);
  } else {
    Am_INTER_TRACE_PRINT(
        interp, "Animator Interrupt of "
                    << interp << "(running uninterrupted); got new value "
                    << new_value);

    Am_Value_List values;
    values = interp.Get(Am_VALUES);
    int curr_phase = interp.Get(Am_CURRENT_PHASE);

    if (curr_phase < 0 || curr_phase >= ((int)values.Length()) - 1) {
      // then curr_phase and values are not currently in use -- initialize them
      values = Am_Value_List()
                   .Add(interp.Get(Am_VALUE_1))
                   .Add(interp.Get(Am_VALUE_2));
      curr_phase = 0;
      interp.Set(Am_CURRENT_PHASE, curr_phase);
    }

    values.Add(new_value);
    interp.Set(Am_VALUES, values);

    Am_Set_Animated_Slots(interp);
  }

  return;
}